

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O0

vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> * __thiscall
tandem::detail::extract_exact_tandem_repeats_lz<std::__cxx11::string>
          (vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *__return_storage_ptr__,
          detail *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          uint32_t min_period,uint32_t max_period)

{
  bool bVar1;
  unsigned_long __n;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
  local_80;
  const_iterator local_78;
  reference local_70;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *bucket;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  *__range2;
  undefined1 local_38 [8];
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  sorted_buckets;
  uint32_t max_period_local;
  uint32_t min_period_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_local;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *result;
  
  sorted_buckets.
  super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = SUB84(str,0);
  sorted_buckets.
  super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = min_period;
  extract_maximal_repetitions<std::__cxx11::string>
            ((vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
              *)local_38,this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)str & 0xffffffff),min_period,max_period);
  (__return_storage_ptr__->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::vector(__return_storage_ptr__);
  __n = count_runs<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                  ((vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                    *)local_38);
  std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::reserve(__return_storage_ptr__,__n);
  __end0 = std::
           vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
           ::begin((vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                    *)local_38);
  bucket = (vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *)
           std::
           vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
           ::end((vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                  *)local_38);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_*,_std::vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>_>
                                     *)&bucket), bVar1) {
    local_70 = __gnu_cxx::
               __normal_iterator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_*,_std::vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>_>
               ::operator*(&__end0);
    local_80._M_current =
         (Repeat *)
         std::end<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                   (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<tandem::Repeat_const*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
    ::__normal_iterator<tandem::Repeat*>
              ((__normal_iterator<tandem::Repeat_const*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>
                *)&local_78,&local_80);
    __first = std::cbegin<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>(local_70);
    __last = std::cend<std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>(local_70);
    std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>::
    insert<__gnu_cxx::__normal_iterator<tandem::Repeat_const*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>,void>
              ((vector<tandem::Repeat,std::allocator<tandem::Repeat>> *)__return_storage_ptr__,
               local_78,(__normal_iterator<const_tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                         )__first._M_current,
               (__normal_iterator<const_tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                )__last._M_current);
    std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::clear(local_70);
    std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::shrink_to_fit(local_70);
    __gnu_cxx::
    __normal_iterator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_*,_std::vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  ::~vector((vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Repeat>
extract_exact_tandem_repeats_lz(const T& str, const std::uint32_t min_period, const std::uint32_t max_period)
{
    auto sorted_buckets = detail::extract_maximal_repetitions(str, min_period, max_period);
    std::vector<Repeat> result {};
    result.reserve(detail::count_runs(sorted_buckets));
    for (auto& bucket : sorted_buckets) {
        result.insert(std::end(result), std::cbegin(bucket), std::cend(bucket));
        bucket.clear();
        bucket.shrink_to_fit();
    }
    return result;
}